

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  AnnotationOptsT annotO;
  Slicer *this;
  long lVar2;
  pointer m;
  type pMVar3;
  ulong uVar4;
  LLVMDependenceGraph *pLVar5;
  char **in_RSI;
  uint in_EDI;
  StringRef SVar6;
  DGDumper dumper;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> criteria_nodes;
  ModuleAnnotator annotator;
  Slicer slicer;
  Slicer slicer_1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> csvalues;
  ModuleWriter writer;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  string *in_stack_fffffffffffff6f8;
  undefined1 uVar7;
  Slicer *in_stack_fffffffffffff700;
  Slicer *in_stack_fffffffffffff710;
  set local_8d8 [16];
  string *in_stack_fffffffffffff738;
  Slicer *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff768;
  Module *in_stack_fffffffffffff770;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  *in_stack_fffffffffffff7d8;
  Slicer *in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7ef;
  Slicer *in_stack_fffffffffffff7f0;
  Module local_300 [24];
  ModuleWriter local_2e8;
  size_t local_2d8;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int iVar8;
  DGDumper *in_stack_fffffffffffffd40;
  LLVMContext local_2b8 [15];
  undefined1 local_2a9;
  undefined1 local_2a8 [32];
  Offset in_stack_fffffffffffffd78;
  _Base_ptr in_stack_fffffffffffffd80;
  bool local_137;
  string asStack_130 [82];
  bool local_de;
  bool local_dd;
  string asStack_d8 [32];
  string asStack_b8 [32];
  string asStack_98 [104];
  undefined1 local_30 [32];
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  std::function<void(llvm::raw_ostream&)>::function<main::__0,void>
            ((function<void_(llvm::raw_ostream_&)> *)in_stack_fffffffffffff700,
             (anon_class_1_0_00000001 *)in_stack_fffffffffffff6f8);
  llvm::cl::SetVersionPrinter(local_30);
  std::function<void_(llvm::raw_ostream_&)>::~function
            ((function<void_(llvm::raw_ostream_&)> *)0x196244);
  parseSlicerOptions((int)local_2a8,(char **)(ulong)local_8,(bool)local_10._0_1_,true);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x19627c);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x196297);
  if (bVar1) {
    local_2a9 = 1;
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,_false,_llvm::cl::parser<bool>_> *)in_stack_fffffffffffff700,
               (bool *)in_stack_fffffffffffff6f8);
  }
  llvm::LLVMContext::LLVMContext(local_2b8);
  parseModule(&stack0xfffffffffffffd40,(LLVMContext *)"llvm-slicer",(SlicerOptions *)local_2b8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1962f7);
  if (!bVar1) {
    local_4 = 1;
    goto LAB_00196b86;
  }
  this = (Slicer *)
         std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator->
                   ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x196323);
  llvm::StringRef::StringRef((StringRef *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffff6f8 >> 0x38);
  SVar6.Length = local_2d8;
  SVar6.Data = (char *)this;
  lVar2 = llvm::Module::getFunction(SVar6);
  if (lVar2 == 0) {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
    local_4 = 1;
    goto LAB_00196b86;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1963cf);
  maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  m = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1963eb);
  ModuleWriter::ModuleWriter(&local_2e8,(SlicerOptions *)local_2a8,m);
  ModuleWriter::removeUnusedFromModule((ModuleWriter *)in_stack_fffffffffffff700);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x196423);
  if (bVar1) {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
    std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
              ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x19644a);
    maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x19646c);
    local_4 = ModuleWriter::saveModule
                        ((ModuleWriter *)this,SUB81((ulong)in_stack_fffffffffffff700 >> 0x38,0));
    goto LAB_00196b86;
  }
  if (((local_de & 1U) != 0) && ((local_137 & 1U) != 0)) {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
    local_de = false;
  }
  if ((local_de & 1U) != 0) {
    pMVar3 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                       ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                        in_stack_fffffffffffff700);
    getSlicingCriteriaValues
              (local_300,(string *)pMVar3,asStack_d8,asStack_b8,(bool)((char)local_2a8 + '\x10'));
    bVar1 = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::empty
                      ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
                       in_stack_fffffffffffff710);
    if (bVar1) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
      std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1965ae);
      Slicer::Slicer(in_stack_fffffffffffff710,(Module *)this,
                     (SlicerOptions *)in_stack_fffffffffffff700);
      bVar1 = Slicer::createEmptyMain(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
      if (bVar1) {
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x196612);
        maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
        llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x196634);
        local_4 = ModuleWriter::cleanAndSaveModule
                            ((ModuleWriter *)in_stack_fffffffffffff700,(bool)uVar7);
      }
      else {
        llvm::errs();
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
        local_4 = 1;
      }
      iVar8 = 1;
      Slicer::~Slicer(in_stack_fffffffffffff700);
    }
    else {
      pMVar3 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                         ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                          in_stack_fffffffffffff700);
      uVar4 = dg::llvmdg::cutoffDivergingBranches(pMVar3,asStack_130,(vector *)local_300);
      if ((uVar4 & 1) == 0) {
        llvm::errs();
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
        local_4 = 1;
        iVar8 = 1;
      }
      else {
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1966d4);
        maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
        iVar8 = 0;
      }
    }
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~vector
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               in_stack_fffffffffffff710);
    if (iVar8 != 0) goto LAB_00196b86;
    in_stack_fffffffffffffd3c = 0;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x19671b);
  Slicer::Slicer(in_stack_fffffffffffff710,(Module *)this,(SlicerOptions *)in_stack_fffffffffffff700
                );
  bVar1 = Slicer::buildDG(this,SUB81((ulong)in_stack_fffffffffffff700 >> 0x38,0));
  if (bVar1) {
    in_stack_fffffffffffff700 = (Slicer *)Slicer::getDG((Slicer *)0x196779);
    annotO = parseAnnotationOptions(in_stack_fffffffffffff738);
    ModuleAnnotator::ModuleAnnotator
              ((ModuleAnnotator *)&stack0xfffffffffffff758,(SlicerOptions *)local_2a8,
               (LLVMDependenceGraph *)in_stack_fffffffffffff700,annotO);
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x1967b4);
    pLVar5 = Slicer::getDG((Slicer *)0x1967be);
    uVar4 = getSlicingCriteriaNodes
                      (pLVar5,asStack_d8,asStack_b8,asStack_98,local_8d8,(bool)(local_dd & 1));
    if ((uVar4 & 1) == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
      bVar1 = ModuleAnnotator::shouldAnnotate((ModuleAnnotator *)&stack0xfffffffffffff758);
      if (bVar1) {
        Slicer::computeDependencies(in_stack_fffffffffffff750);
        ModuleAnnotator::annotate
                  ((ModuleAnnotator *)in_stack_fffffffffffffd80,
                   (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)in_stack_fffffffffffffd78.offset);
      }
      local_4 = 1;
    }
    else {
      bVar1 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
              empty((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                     *)0x196890);
      if (bVar1) {
        llvm::errs();
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(string *)this);
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
        bVar1 = ModuleAnnotator::shouldAnnotate((ModuleAnnotator *)&stack0xfffffffffffff758);
        if (bVar1) {
          Slicer::computeDependencies(in_stack_fffffffffffff750);
          ModuleAnnotator::annotate
                    ((ModuleAnnotator *)in_stack_fffffffffffffd80,
                     (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                      *)in_stack_fffffffffffffd78.offset);
        }
        bVar1 = Slicer::createEmptyMain(in_stack_fffffffffffff7f0,(bool)in_stack_fffffffffffff7ef);
        if (bVar1) {
          std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x19696d);
          maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
          llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x19698f);
          local_4 = ModuleWriter::cleanAndSaveModule
                              ((ModuleWriter *)in_stack_fffffffffffff700,(bool)uVar7);
        }
        else {
          llvm::errs();
          llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
          local_4 = 1;
        }
      }
      else {
        bVar1 = Slicer::mark(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        if (bVar1) {
          bVar1 = ModuleAnnotator::shouldAnnotate((ModuleAnnotator *)&stack0xfffffffffffff758);
          if (bVar1) {
            ModuleAnnotator::annotate
                      ((ModuleAnnotator *)in_stack_fffffffffffffd80,
                       (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                        *)in_stack_fffffffffffffd78.offset);
          }
          pLVar5 = Slicer::getDG((Slicer *)0x196a24);
          bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x196a3b);
          DGDumper::DGDumper((DGDumper *)&stack0xfffffffffffff710,(SlicerOptions *)local_2a8,pLVar5,
                             bVar1,0x154);
          uVar7 = (undefined1)((ulong)pLVar5 >> 0x38);
          bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x196a70);
          if (bVar1) {
            DGDumper::dumpToDot(in_stack_fffffffffffffd40,
                                (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ));
            bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                              ((opt_storage<bool,_false,_false> *)0x196a97);
            if (bVar1) {
              local_4 = 0;
              goto LAB_00196b72;
            }
          }
          bVar1 = Slicer::slice(in_stack_fffffffffffff750);
          if (bVar1) {
            bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                              ((opt_storage<bool,_false,_false> *)0x196b07);
            if (bVar1) {
              DGDumper::dumpToDot(in_stack_fffffffffffffd40,
                                  (char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                   in_stack_fffffffffffffd38));
            }
            std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                      ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x196b2b);
            maybe_print_statistics(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
            llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x196b4d);
            local_4 = ModuleWriter::cleanAndSaveModule
                                ((ModuleWriter *)in_stack_fffffffffffff700,(bool)uVar7);
          }
          else {
            llvm::errs();
            llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
            local_4 = 1;
          }
        }
        else {
          llvm::errs();
          llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
          local_4 = 1;
        }
      }
    }
LAB_00196b72:
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::~set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x196b7c);
  }
  else {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_fffffffffffff710,(char *)this);
    local_4 = 1;
  }
  Slicer::~Slicer(in_stack_fffffffffffff700);
LAB_00196b86:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffff700);
  llvm::LLVMContext::~LLVMContext(local_2b8);
  SlicerOptions::~SlicerOptions((SlicerOptions *)in_stack_fffffffffffff700);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);

#if ((LLVM_VERSION_MAJOR >= 6))
    llvm::cl::SetVersionPrinter([](llvm::raw_ostream & /*unused*/) {
        printf("%s\n", GIT_VERSION);
    });
#else
    llvm::cl::SetVersionPrinter([]() { printf("%s\n", GIT_VERSION); });
#endif

    SlicerOptions options = parseSlicerOptions(argc, argv,
                                               /* requireCrit = */ true);

    if (enable_debug) {
        DBG_ENABLE();
    }

    // dump_dg_only implies dumg_dg
    if (dump_dg_only) {
        dump_dg = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-slicer", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    maybe_print_statistics(M.get(), "Statistics before ");

    // remove unused from module, we don't need that
    ModuleWriter writer(options, M.get());
    writer.removeUnusedFromModule();

    if (remove_unused_only) {
        errs() << "[llvm-slicer] removed unused parts of module, exiting...\n";
        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.saveModule(should_verify_module);
    }

    /// ---------------
    // slice the code
    /// ---------------
    if (options.cutoffDiverging && options.dgOptions.threads) {
        llvm::errs() << "[llvm-slicer] threads are enabled, not cutting off "
                        "diverging\n";
        options.cutoffDiverging = false;
    }

    if (options.cutoffDiverging) {
        DBG(llvm - slicer, "Searching for slicing criteria values");
        auto csvalues = getSlicingCriteriaValues(
                *M, options.slicingCriteria, options.legacySlicingCriteria,
                options.legacySecondarySlicingCriteria,
                options.criteriaAreNextInstr);
        if (csvalues.empty()) {
            llvm::errs() << "No reachable slicing criteria: '"
                         << options.slicingCriteria << "' '"
                         << options.legacySlicingCriteria << "'\n";
            ::Slicer slicer(M.get(), options);
            if (!slicer.createEmptyMain()) {
                llvm::errs() << "ERROR: failed creating an empty main\n";
                return 1;
            }

            maybe_print_statistics(M.get(), "Statistics after ");
            return writer.cleanAndSaveModule(should_verify_module);
        }

        DBG(llvm - slicer, "Cutting off diverging branches");
        if (!llvmdg::cutoffDivergingBranches(
                    *M, options.dgOptions.entryFunction, csvalues)) {
            errs() << "[llvm-slicer]: Failed cutting off diverging branches\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after cutoff-diverging ");
    }

    ::Slicer slicer(M.get(), options);
    if (!slicer.buildDG()) {
        errs() << "ERROR: Failed building DG\n";
        return 1;
    }

    ModuleAnnotator annotator(options, &slicer.getDG(),
                              parseAnnotationOptions(annotationOpts));

    std::set<LLVMNode *> criteria_nodes;
    if (!getSlicingCriteriaNodes(slicer.getDG(), options.slicingCriteria,
                                 options.legacySlicingCriteria,
                                 options.legacySecondarySlicingCriteria,
                                 criteria_nodes,
                                 options.criteriaAreNextInstr)) {
        llvm::errs() << "ERROR: Failed finding slicing criteria: '"
                     << options.slicingCriteria << "'\n";

        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        return 1;
    }

    if (criteria_nodes.empty()) {
        llvm::errs() << "No reachable slicing criteria: '"
                     << options.slicingCriteria << "' '"
                     << options.legacySlicingCriteria << "'\n";
        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        if (!slicer.createEmptyMain()) {
            llvm::errs() << "ERROR: failed creating an empty main\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.cleanAndSaveModule(should_verify_module);
    }

    // mark nodes that are going to be in the slice
    if (!slicer.mark(criteria_nodes)) {
        llvm::errs() << "Finding dependent nodes failed\n";
        return 1;
    }

    // print debugging llvm IR if user asked for it
    if (annotator.shouldAnnotate())
        annotator.annotate(&criteria_nodes);

    DGDumper dumper(options, &slicer.getDG(), dump_bb_only);
    if (dump_dg) {
        dumper.dumpToDot();

        if (dump_dg_only)
            return 0;
    }

    // slice the graph
    if (!slicer.slice()) {
        errs() << "ERROR: Slicing failed\n";
        return 1;
    }

    if (dump_dg) {
        dumper.dumpToDot(".sliced.dot");
    }

    // remove unused from module again, since slicing
    // could and probably did make some other parts unused
    maybe_print_statistics(M.get(), "Statistics after ");
    return writer.cleanAndSaveModule(should_verify_module);
}